

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

Error miniros::systemdNotify(char *status)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  SmartFd fd;
  SmartFd local_9c;
  undefined1 local_96 [18];
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 uStack_44;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_44 = 0;
  uStack_3c = 0;
  local_38 = 0;
  local_54 = 0;
  uStack_4c = 0;
  local_64 = 0;
  uStack_5c = 0;
  local_74 = 0;
  uStack_6c = 0;
  local_84 = 0;
  uStack_7c = 0;
  local_96._2_8_ = 0;
  local_96._10_8_ = 0;
  local_96._0_2_ = 1;
  local_9c.fd = -1;
  if ((status == (char *)0x0) || (__n = strlen(status), __n == 0)) {
LAB_001c9443:
    SmartFd::~SmartFd(&local_9c);
    return (Error)Ok;
  }
  pcVar2 = getenv("NOTIFY_SOCKET");
  if (pcVar2 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "No NOTIFY_SOCKET variable was set. No systemd notification will be done.",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    SmartFd::~SmartFd(&local_9c);
    return (Error)SystemError;
  }
  if (((*pcVar2 != '@') && (*pcVar2 != '/')) || (sVar3 = strlen(pcVar2), 0x6b < sVar3))
  goto LAB_001c9443;
  memcpy(local_96 + 2,pcVar2,sVar3);
  if (local_96[2] == '@') {
    local_96._2_8_ = local_96._2_8_ & 0xffffffffffffff00;
  }
  local_9c.fd = socket(1,0x80002,0);
  if (local_9c.fd < 0) {
    lVar5 = 0x20;
    pcVar2 = "Failed to create sdnotify socket";
  }
  else {
    iVar1 = ::connect(local_9c.fd,(sockaddr *)local_96,(int)sVar3 + 2);
    if (iVar1 == 0) {
      sVar3 = write(local_9c.fd,status,__n);
      if (sVar3 == __n) goto LAB_001c9443;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to write sdnotify message",0x20);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      if (-1 < (long)sVar3) goto LAB_001c9443;
      goto LAB_001c955d;
    }
    lVar5 = 0x21;
    pcVar2 = "Failed to connect sdnotify socket";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
LAB_001c955d:
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  SmartFd::~SmartFd(&local_9c);
  if (iVar1 == 0) {
    return (Error)SystemError;
  }
  return (Error)Ok;
}

Assistant:

static int portableSystemdNotify(const char *message) {

  union sockaddr_union {
    struct sockaddr sa;
    struct sockaddr_un sun;
  } socket_addr = {};

  socket_addr.sun.sun_family = AF_UNIX;

  size_t path_length, message_length;
  SmartFd fd;

  const char *socket_path;

  /* Verify the argument first */
  if (!message)
    return -EINVAL;

  message_length = strlen(message);
  if (message_length == 0)
    return -EINVAL;

  /* If the variable is not set, the protocol is a noop */
  socket_path = getenv("NOTIFY_SOCKET");
  if (!socket_path) {
    std::cerr << "No NOTIFY_SOCKET variable was set. No systemd notification will be done." << std::endl;
    return 0; /* Not set? Nothing to do */
  }

  /* Only AF_UNIX is supported, with path or abstract sockets */
  if (socket_path[0] != '/' && socket_path[0] != '@')
    return -EAFNOSUPPORT;

  path_length = strlen(socket_path);
  /* Ensure there is room for NUL byte */
  if (path_length >= sizeof(socket_addr.sun.sun_path))
    return -E2BIG;

  memcpy(socket_addr.sun.sun_path, socket_path, path_length);

  /* Support for abstract socket */
  if (socket_addr.sun.sun_path[0] == '@')
    socket_addr.sun.sun_path[0] = 0;

  fd.fd = socket(AF_UNIX, SOCK_DGRAM|SOCK_CLOEXEC, 0);
  if (fd < 0) {
    std::cerr << "Failed to create sdnotify socket" << std::endl;
    return -errno;
  }

  if (connect(fd, &socket_addr.sa, offsetof(struct sockaddr_un, sun_path) + path_length) != 0) {
    std::cerr << "Failed to connect sdnotify socket" << std::endl;
    return -errno;
  }

  ssize_t written = write(fd, message, message_length);
  if (written != (ssize_t) message_length) {
    std::cerr << "Failed to write sdnotify message" << std::endl;
    return written < 0 ? -errno : -EPROTO;
  }

  return 1; /* Notified! */
}